

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.cpp
# Opt level: O2

bool __thiscall rudp::session::check_common_header(session *this,buffer_ptr_t *incoming)

{
  uchar uVar1;
  byte bVar2;
  byte bVar3;
  reference puVar4;
  byte *pbVar5;
  byte bVar6;
  byte bVar7;
  bool bVar8;
  
  bVar8 = false;
  puVar4 = boost::container::
           vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
           ::operator[](&((incoming->
                          super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr)->
                         super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                        ,0);
  uVar1 = *puVar4;
  pbVar5 = boost::container::
           vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
           ::operator[](&((incoming->
                          super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr)->
                         super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                        ,0);
  bVar6 = (*pbVar5 & 0x40) >> 6;
  pbVar5 = boost::container::
           vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
           ::operator[](&((incoming->
                          super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr)->
                         super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                        ,0);
  bVar7 = *pbVar5;
  pbVar5 = boost::container::
           vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
           ::operator[](&((incoming->
                          super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr)->
                         super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                        ,0);
  bVar2 = *pbVar5;
  pbVar5 = boost::container::
           vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
           ::operator[](&((incoming->
                          super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr)->
                         super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                        ,0);
  bVar3 = *pbVar5;
  boost::container::
  vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
  ::operator[](&((incoming->
                 super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr)->
                super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
               ,0);
  pbVar5 = boost::container::
           vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
           ::operator[](&((incoming->
                          super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr)->
                         super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                        ,0);
  if ((((bVar7 & 0x20) == 0 && (bVar3 & 8) == 0) | bVar6) == 1) {
    bVar7 = ((bVar3 & 8) >> 3) +
            (((bVar7 & 0x20) >> 5) - ((char)uVar1 >> 7)) + ((bVar2 >> 4 & 1) != 0) +
            ((*pbVar5 >> 1 & 1) != 0);
    if (bVar7 != 0) {
      bVar6 = bVar7;
    }
    bVar8 = bVar6 == 1;
  }
  return bVar8;
}

Assistant:

bool session::check_common_header( const buffer_ptr_t &incoming ) {
    const bool syn = (*incoming)[ 0 ] & 0x80;
    const bool ack = (*incoming)[ 0 ] & 0x40;
    const bool eak = (*incoming)[ 0 ] & 0x20;
    const bool rst = (*incoming)[ 0 ] & 0x10;
    const bool nul = (*incoming)[ 0 ] & 0x08;
    const bool chk = (*incoming)[ 0 ] & 0x04;
    const bool tcs = (*incoming)[ 0 ] & 0x02;
    unsigned int role_count = 0u;
    if( syn ) ++role_count;
    if( eak ) ++role_count;
    if( rst ) ++role_count;
    if( nul ) ++role_count;
    if( tcs ) ++role_count;
    if( ( role_count == 0 ) && ack ) ++role_count;
    if( ( eak || nul ) && !ack ) return false;
    return role_count == 1u;
  }